

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

bool __thiscall
re2::NFA::Search(NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
                StringPiece *submatch,int nsubmatch)

{
  size_t __n;
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  Inst *pIVar5;
  char **ppcVar6;
  undefined8 uVar7;
  char *pcVar8;
  StringPiece *pSVar9;
  Threadq *pTVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  byte *pbVar14;
  char **ppcVar15;
  Thread *pTVar16;
  ostream *poVar17;
  pointer pIVar18;
  bool bVar19;
  uint uVar20;
  Threadq *nextq;
  Threadq *runq;
  ulong uVar21;
  uint32 flag;
  byte *pbVar22;
  byte *pbVar23;
  long lVar24;
  size_t sVar25;
  bool bVar26;
  StringPiece context;
  StringPiece local_1d8;
  StringPiece *local_1c8;
  Threadq *local_1c0;
  StringPiece *local_1b8;
  LogMessage local_1b0;
  
  if (this->start_ == 0) {
    return false;
  }
  local_1d8.ptr_ = const_context->ptr_;
  local_1d8.length_ = const_context->length_;
  local_1d8._12_4_ = *(undefined4 *)&const_context->field_0xc;
  if ((byte *)local_1d8.ptr_ == (byte *)0x0) {
    local_1d8.length_ = text->length_;
    local_1d8.ptr_ = text->ptr_;
  }
  pcVar8 = local_1d8.ptr_;
  pbVar23 = (byte *)text->ptr_;
  local_1b8 = submatch;
  if (local_1d8.ptr_ <= pbVar23) {
    pbVar14 = pbVar23 + text->length_;
    if (pbVar14 <= local_1d8.ptr_ + local_1d8.length_) {
      bVar19 = this->prog_->anchor_start_;
      if (((byte *)local_1d8.ptr_ != pbVar23 & bVar19) != 0) {
        return false;
      }
      bVar11 = this->prog_->anchor_end_;
      if ((bVar11 == true) && ((byte *)(local_1d8.ptr_ + local_1d8.length_) != pbVar14)) {
        return false;
      }
      if (bVar11 != false) {
        this->endmatch_ = true;
        this->etext_ = (char *)pbVar14;
        longest = true;
      }
      if (-1 < nsubmatch) {
        this->ncapture_ = nsubmatch * 2;
        this->longest_ = longest;
        if (nsubmatch == 0) {
          this->ncapture_ = 2;
        }
        __n = (long)this->ncapture_ * 8;
        sVar25 = __n;
        if ((long)this->ncapture_ < 0) {
          sVar25 = 0xffffffffffffffff;
        }
        local_1c8 = text;
        ppcVar15 = (char **)operator_new__(sVar25);
        this->match_ = ppcVar15;
        this->matched_ = false;
        this->btext_ = pcVar8;
        (this->q0_).size_ = 0;
        bVar11 = false;
        (this->q1_).size_ = 0;
        memset(ppcVar15,0,__n);
        if (pcVar8 < pbVar23) {
          bVar1 = pbVar23[-1];
          bVar11 = (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10) ||
                   (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a;
        }
        bVar1 = bVar19 | anchored;
        pTVar10 = &this->q1_;
        runq = &this->q0_;
        do {
          nextq = pTVar10;
          pSVar9 = local_1c8;
          if (pbVar23 == (byte *)local_1d8.ptr_) {
            uVar13 = 5;
          }
          else {
            uVar13 = 0;
            if (pbVar23 <= local_1d8.ptr_ + local_1d8.length_) {
              uVar13 = (uint)(pbVar23[-1] == 10);
            }
          }
          pbVar14 = (byte *)(local_1d8.ptr_ + local_1d8.length_);
          if (pbVar23 == pbVar14) {
            uVar12 = uVar13 | 10;
          }
          else {
            uVar12 = uVar13;
            if ((pbVar23 < pbVar14) && (uVar12 = uVar13 | 2, *pbVar23 != 10)) {
              uVar12 = uVar13;
            }
          }
          bVar19 = false;
          if (pbVar23 < pbVar14) {
            bVar2 = *pbVar23;
            bVar19 = (bVar2 == 0x5f || (byte)(bVar2 - 0x30) < 10) ||
                     (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a;
          }
          uVar13 = 0xffffffff;
          if (pbVar23 < local_1c8->ptr_ + local_1c8->length_) {
            uVar13 = (uint)*pbVar23;
          }
          flag = (uint)(bVar19 == bVar11) * 0x10 + uVar12 + 0x10;
          local_1c0 = runq;
          uVar13 = Step(this,runq,nextq,uVar13,flag,(char *)(pbVar23 + -1));
          if (runq->size_ != 0) {
            __assert_fail("(runq->size()) == (0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                          ,0x22b,
                          "bool re2::NFA::Search(const StringPiece &, const StringPiece &, bool, bool, StringPiece *, int)"
                         );
          }
          runq->size_ = 0;
          pbVar14 = (byte *)pSVar9->ptr_;
          pbVar22 = pbVar14 + pSVar9->length_;
          if (uVar13 == 0) {
            if (pbVar22 < pbVar23) {
              bVar26 = false;
              pbVar22 = pbVar23;
            }
            else {
              pbVar22 = pbVar23;
              if (((bVar1 & pbVar23 != pbVar14) == 0) && (this->matched_ == false)) {
                uVar13 = Prog::first_byte(this->prog_);
                pSVar9 = local_1c8;
                if (((bVar1 == 0) &&
                    (((-1 < (int)uVar13 && (nextq->size_ == 0)) &&
                     (pbVar14 = (byte *)(local_1c8->ptr_ + local_1c8->length_), pbVar23 < pbVar14)))
                    ) && (uVar13 != *pbVar23)) {
                  pbVar23 = (byte *)memchr(pbVar23,uVar13,(long)pbVar14 - (long)pbVar23);
                  if (pbVar23 == (byte *)0x0) {
                    bVar19 = false;
                  }
                  else {
                    bVar2 = *pbVar23;
                    bVar19 = (bVar2 == 0x5f || (byte)(bVar2 - 0x30) < 10) ||
                             (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a;
                    pbVar14 = pbVar23;
                  }
                  flag = Prog::EmptyFlags(&local_1d8,(char *)pbVar14);
                  pbVar23 = pbVar14;
                }
                pTVar16 = this->free_threads_;
                if (pTVar16 == (Thread *)0x0) {
                  pTVar16 = (Thread *)operator_new(0x10);
                  (pTVar16->field_0).ref = 1;
                  uVar21 = (long)this->ncapture_ * 8;
                  if ((long)this->ncapture_ < 0) {
                    uVar21 = 0xffffffffffffffff;
                  }
                  ppcVar15 = (char **)operator_new__(uVar21);
                  pTVar16->capture = ppcVar15;
                }
                else {
                  this->free_threads_ = (Thread *)pTVar16->field_0;
                  (pTVar16->field_0).ref = 1;
                }
                iVar4 = this->ncapture_;
                if (0 < (long)iVar4) {
                  ppcVar15 = pTVar16->capture;
                  ppcVar6 = this->match_;
                  uVar21 = 0;
                  do {
                    ppcVar15[uVar21] = ppcVar6[uVar21];
                    ppcVar15[uVar21 + 1] = ppcVar6[uVar21 + 1];
                    uVar21 = uVar21 + 2;
                  } while (uVar21 < (ulong)(long)iVar4);
                }
                *pTVar16->capture = (char *)pbVar23;
                uVar13 = 0xffffffff;
                if (pbVar23 < pSVar9->ptr_ + pSVar9->length_) {
                  uVar13 = (uint)*pbVar23;
                }
                AddToThreadq(this,nextq,this->start_,uVar13,flag,(char *)pbVar23,pTVar16);
                iVar3 = (pTVar16->field_0).ref;
                iVar4 = iVar3 + -1;
                (pTVar16->field_0).ref = iVar4;
                pbVar22 = pbVar23;
                if (iVar3 < 2) {
                  if (iVar4 != 0) goto LAB_0012b02f;
                  pTVar16->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                  this->free_threads_ = pTVar16;
                }
              }
              bVar26 = nextq->size_ != 0;
              runq = local_1c0;
              if (bVar26) {
                bVar11 = bVar19;
              }
            }
          }
          else {
            do {
              pIVar5 = this->prog_->inst_;
              uVar12 = pIVar5[(int)uVar13].out_opcode_;
              uVar20 = uVar12 & 7;
              if (uVar20 == 3) {
                if (pIVar5[(int)uVar13].field_1.cap_ < this->ncapture_) {
                  this->match_[pIVar5[(int)uVar13].field_1.cap_] = (char *)pbVar22;
                }
LAB_0012ac43:
                uVar13 = uVar12 >> 4;
                bVar19 = true;
              }
              else if (uVar20 == 5) {
                this->match_[1] = (char *)pbVar22;
                this->matched_ = true;
                bVar19 = false;
              }
              else {
                if (uVar20 == 6) goto LAB_0012ac43;
                LogMessage::LogMessage
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                           ,0x235,3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1b0.str_,"Unexpected opcode in short circuit: ",0x24);
                std::ostream::operator<<
                          ((ostream *)&local_1b0.str_,pIVar5[(int)uVar13].out_opcode_ & 7);
                LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
                bVar19 = false;
              }
            } while (bVar19);
            bVar26 = false;
            runq = local_1c0;
          }
          pbVar23 = pbVar22 + 1;
          pTVar10 = runq;
          runq = nextq;
        } while (bVar26);
        if (nextq->size_ != 0) {
          pIVar18 = (nextq->dense_).
                    super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pTVar16 = pIVar18->second;
            if (pTVar16 != (Thread *)0x0) {
              iVar3 = (pTVar16->field_0).ref;
              iVar4 = iVar3 + -1;
              (pTVar16->field_0).ref = iVar4;
              if (iVar3 < 2) {
                if (iVar4 != 0) {
LAB_0012b02f:
                  __assert_fail("(t->ref) == (0)",
                                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                                ,0xb7,"void re2::NFA::Decref(Thread *)");
                }
                pTVar16->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
                this->free_threads_ = pTVar16;
              }
            }
            pIVar18 = pIVar18 + 1;
          } while (pIVar18 !=
                   (nextq->dense_).
                   super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                   ._M_impl.super__Vector_impl_data._M_start + nextq->size_);
        }
        bVar19 = this->matched_;
        if (nsubmatch != 0 && bVar19 == true) {
          ppcVar15 = this->match_;
          uVar21 = 1;
          if (1 < nsubmatch) {
            uVar21 = (ulong)(uint)nsubmatch;
          }
          lVar24 = 0;
          do {
            uVar7 = *(undefined8 *)((long)ppcVar15 + lVar24);
            iVar4 = *(int *)((long)ppcVar15 + lVar24 + 8);
            *(undefined8 *)((long)&local_1b8->ptr_ + lVar24) = uVar7;
            *(int *)((long)&local_1b8->length_ + lVar24) = iVar4 - (int)uVar7;
            lVar24 = lVar24 + 0x10;
          } while (uVar21 * 0x10 != lVar24);
          return bVar19;
        }
        return bVar19;
      }
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x1d1
                 ,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Bad args: nsubmatch=",0x14);
      std::ostream::operator<<((ostream *)&local_1b0.str_,nsubmatch);
      goto LAB_0012af06;
    }
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",0x1bd,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0.str_,"Bad args: context does not contain text ",0x28);
  poVar17 = std::ostream::_M_insert<void_const*>(&local_1b0.str_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"+",1);
  poVar17 = (ostream *)std::ostream::operator<<((ostream *)poVar17,local_1d8.length_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  poVar17 = std::ostream::_M_insert<void_const*>(poVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"+",1);
  std::ostream::operator<<((ostream *)poVar17,text->length_);
LAB_0012af06:
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  return false;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;

  if (!StringPieceContains(context, text)) {
    LOG(FATAL) << "Bad args: context does not contain text "
                << reinterpret_cast<const void*>(context.begin())
                << "+" << context.size() << " "
                << reinterpret_cast<const void*>(text.begin())
                << "+" << text.size();
    return false;
  }

  if (prog_->anchor_start() && context.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context.end() != text.end())
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
    etext_ = text.end();
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  matched_ = false;

  // For debugging prints.
  btext_ = context.begin();

  if (Debug) {
    fprintf(stderr, "NFA::Search %s (context: %s) anchored=%d longest=%d\n",
            text.as_string().c_str(), context.as_string().c_str(), anchored,
            longest);
  }

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();
  memset(&match_[0], 0, ncapture_*sizeof match_[0]);
  int wasword = 0;

  if (text.begin() > context.begin())
    wasword = Prog::IsWordChar(text.begin()[-1] & 0xFF);

  // Loop over the text, stepping the machine.
  for (const char* p = text.begin();; p++) {
    // Check for empty-width specials.
    int flag = 0;

    // ^ and \A
    if (p == context.begin())
      flag |= kEmptyBeginText | kEmptyBeginLine;
    else if (p <= context.end() && p[-1] == '\n')
      flag |= kEmptyBeginLine;

    // $ and \z
    if (p == context.end())
      flag |= kEmptyEndText | kEmptyEndLine;
    else if (p < context.end() && p[0] == '\n')
      flag |= kEmptyEndLine;

    // \b and \B
    int isword = 0;
    if (p < context.end())
      isword = Prog::IsWordChar(p[0] & 0xFF);

    if (isword != wasword)
      flag |= kEmptyWordBoundary;
    else
      flag |= kEmptyNonWordBoundary;

    if (Debug) {
      int c = 0;
      if (p == context.begin())
        c = '^';
      else if (p > text.end())
        c = '$';
      else if (p < text.end())
        c = p[0] & 0xFF;

      fprintf(stderr, "%c[%#x/%d/%d]:", c, flag, isword, wasword);
      for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
        Thread* t = i->second;
        if (t == NULL)
          continue;
        fprintf(stderr, " %d%s", i->index(), FormatCapture(t->capture).c_str());
      }
      fprintf(stderr, "\n");
    }

    // Note that we pass p-1 to Step() because it needs the previous pointer
    // value in order to handle Match instructions appropriately. It plumbs
    // c and flag through to AddToThreadq() along with p-1+1, which is p.
    //
    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < text.end() ? p[0] & 0xFF : -1, flag, p-1);
    DCHECK_EQ(runq->size(), 0);
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = text.end();
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > text.end())
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.begin())) {
      // If there's a required first byte for an unanchored search
      // and we're not in the middle of any possible matches,
      // use memchr to search for the byte quickly.
      int fb = prog_->first_byte();
      if (!anchored && runq->size() == 0 &&
          fb >= 0 && p < text.end() && (p[0] & 0xFF) != fb) {
        p = reinterpret_cast<const char*>(memchr(p, fb, text.end() - p));
        if (p == NULL) {
          p = text.end();
          isword = 0;
        } else {
          isword = Prog::IsWordChar(p[0] & 0xFF);
        }
        flag = Prog::EmptyFlags(context, p);
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < text.end() ? p[0] & 0xFF : -1, flag, p, t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      if (Debug)
        fprintf(stderr, "dead\n");
      break;
    }

    wasword = isword;
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i)
    Decref(i->second);

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i].set(match_[2*i],
                      static_cast<int>(match_[2*i+1] - match_[2*i]));
    if (Debug)
      fprintf(stderr, "match (%d,%d)\n",
              static_cast<int>(match_[0] - btext_),
              static_cast<int>(match_[1] - btext_));
    return true;
  }
  VLOG(1) << "No matches found";
  return false;
}